

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  int iVar1;
  _Alloc_hider str;
  bool bVar2;
  char **in_RDX;
  char **extraout_RDX;
  string *str_00;
  int iVar3;
  long lVar4;
  string arg_string;
  
  iVar3 = 1;
  str_00 = (string *)argc;
  do {
    if (*argc <= iVar3) {
      if (g_help_flag != '\0') {
        PrintColorEncoded((char *)str_00);
      }
      return;
    }
    lVar4 = (long)iVar3;
    StreamableToString<char*>(&arg_string,(internal *)(argv + lVar4),in_RDX);
    str = arg_string._M_dataplus;
    bVar2 = ParseBoolFlag(arg_string._M_dataplus._M_p,"also_run_disabled_tests",
                          (bool *)&FLAGS_gtest_also_run_disabled_tests);
    if (bVar2) {
LAB_00141ce4:
      iVar1 = *argc;
      for (; iVar1 != lVar4; lVar4 = lVar4 + 1) {
        argv[lVar4] = argv[lVar4 + 1];
      }
      *argc = iVar1 + -1;
      iVar3 = iVar3 + -1;
    }
    else {
      bVar2 = ParseBoolFlag(str._M_p,"break_on_failure",(bool *)&FLAGS_gtest_break_on_failure);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseBoolFlag(str._M_p,"catch_exceptions",(bool *)&FLAGS_gtest_catch_exceptions);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseStringFlag(str._M_p,"color",(string *)&FLAGS_gtest_color_abi_cxx11_);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseStringFlag(str._M_p,"death_test_style",
                              (string *)&FLAGS_gtest_death_test_style_abi_cxx11_);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseBoolFlag(str._M_p,"death_test_use_fork",(bool *)&FLAGS_gtest_death_test_use_fork)
      ;
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseStringFlag(str._M_p,"filter",(string *)&FLAGS_gtest_filter_abi_cxx11_);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseStringFlag(str._M_p,"internal_run_death_test",
                              (string *)&FLAGS_gtest_internal_run_death_test_abi_cxx11_);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseBoolFlag(str._M_p,"list_tests",(bool *)&FLAGS_gtest_list_tests);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseStringFlag(str._M_p,"output",(string *)&FLAGS_gtest_output_abi_cxx11_);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseBoolFlag(str._M_p,"print_time",(bool *)&FLAGS_gtest_print_time);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseInt32Flag(str._M_p,"random_seed",&FLAGS_gtest_random_seed);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseInt32Flag(str._M_p,"repeat",&FLAGS_gtest_repeat);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseBoolFlag(str._M_p,"shuffle",(bool *)&FLAGS_gtest_shuffle);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseInt32Flag(str._M_p,"stack_trace_depth",&FLAGS_gtest_stack_trace_depth);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseStringFlag(str._M_p,"stream_result_to",
                              (string *)&FLAGS_gtest_stream_result_to_abi_cxx11_);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = ParseBoolFlag(str._M_p,"throw_on_failure",(bool *)&FLAGS_gtest_throw_on_failure);
      if (bVar2) goto LAB_00141ce4;
      bVar2 = std::operator==(&arg_string,"--help");
      if (bVar2) {
LAB_00141d6a:
        g_help_flag = '\x01';
      }
      else {
        bVar2 = std::operator==(&arg_string,"-h");
        if (bVar2) goto LAB_00141d6a;
        bVar2 = std::operator==(&arg_string,"-?");
        if (bVar2) goto LAB_00141d6a;
        bVar2 = std::operator==(&arg_string,"/?");
        if (bVar2) goto LAB_00141d6a;
        bVar2 = HasGoogleTestFlagPrefix((char *)0x141d66);
        if (bVar2) goto LAB_00141d6a;
      }
    }
    str_00 = &arg_string;
    std::__cxx11::string::~string((string *)&arg_string);
    iVar3 = iVar3 + 1;
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    // Do we see a Google Test flag?
    if (ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                      &GTEST_FLAG(also_run_disabled_tests)) ||
        ParseBoolFlag(arg, kBreakOnFailureFlag,
                      &GTEST_FLAG(break_on_failure)) ||
        ParseBoolFlag(arg, kCatchExceptionsFlag,
                      &GTEST_FLAG(catch_exceptions)) ||
        ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
        ParseStringFlag(arg, kDeathTestStyleFlag,
                        &GTEST_FLAG(death_test_style)) ||
        ParseBoolFlag(arg, kDeathTestUseFork,
                      &GTEST_FLAG(death_test_use_fork)) ||
        ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
        ParseStringFlag(arg, kInternalRunDeathTestFlag,
                        &GTEST_FLAG(internal_run_death_test)) ||
        ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
        ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
        ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
        ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
        ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
        ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
        ParseInt32Flag(arg, kStackTraceDepthFlag,
                       &GTEST_FLAG(stack_trace_depth)) ||
        ParseStringFlag(arg, kStreamResultToFlag,
                        &GTEST_FLAG(stream_result_to)) ||
        ParseBoolFlag(arg, kThrowOnFailureFlag,
                      &GTEST_FLAG(throw_on_failure))
        ) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}